

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O0

void __thiscall
Js::Utf8SourceInfo::GetLineInfoForCharPosition
          (Utf8SourceInfo *this,charcount_t charPosition,charcount_t *outLineNumber,
          charcount_t *outColumn,charcount_t *outLineByteOffset,bool allowSlowLookup)

{
  code *pcVar1;
  bool bVar2;
  LineOffsetCache **ppLVar3;
  undefined4 *puVar4;
  LPCUTF8 puVar5;
  size_t sVar6;
  LineOffsetCache *this_00;
  charcount_t local_5c;
  LPCUTF8 puStack_58;
  charcount_t byteStartOffset;
  LPCUTF8 sourceAfterBOM;
  LPCUTF8 sourceEnd;
  LPCUTF8 sourceStart;
  charcount_t local_38;
  int line;
  charcount_t lineCharOffset;
  bool allowSlowLookup_local;
  charcount_t *outLineByteOffset_local;
  charcount_t *outColumn_local;
  charcount_t *outLineNumber_local;
  Utf8SourceInfo *pUStack_10;
  charcount_t charPosition_local;
  Utf8SourceInfo *this_local;
  
  line._3_1_ = allowSlowLookup;
  _lineCharOffset = outLineByteOffset;
  outLineByteOffset_local = outColumn;
  outColumn_local = outLineNumber;
  outLineNumber_local._4_4_ = charPosition;
  pUStack_10 = this;
  ppLVar3 = Memory::WriteBarrierPtr::operator_cast_to_LineOffsetCache__
                      ((WriteBarrierPtr *)&this->m_lineOffsetCache);
  if ((*ppLVar3 == (LineOffsetCache *)0x0) && ((line._3_1_ & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x125,"(this->m_lineOffsetCache != nullptr || allowSlowLookup)",
                                "LineOffsetCache wasn\'t created, EnsureLineOffsetCache should have been called."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (((outColumn_local == (charcount_t *)0x0) || (outLineByteOffset_local == (charcount_t *)0x0))
     || (_lineCharOffset == (charcount_t *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x126,
                                "(outLineNumber != nullptr && outColumn != nullptr && outLineByteOffset != nullptr)"
                                ,"Expected out parameter\'s can\'t be a nullptr.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_38 = 0;
  sourceStart._4_4_ = 0;
  ppLVar3 = Memory::WriteBarrierPtr::operator_cast_to_LineOffsetCache__
                      ((WriteBarrierPtr *)&this->m_lineOffsetCache);
  if (*ppLVar3 == (LineOffsetCache *)0x0) {
    puVar5 = GetSource(this,L"Utf8SourceInfo::AllocateLineOffsetCache");
    sourceEnd = puVar5;
    sVar6 = GetCbLength(this,L"Utf8SourceInfo::AllocateLineOffsetCache");
    sourceAfterBOM = puVar5 + sVar6;
    puStack_58 = sourceEnd;
    local_38 = FunctionBody::SkipByteOrderMark(&stack0xffffffffffffffa8);
    if (0xfffffffe < (long)puStack_58 - (long)sourceEnd) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                  ,0x131,
                                  "((sourceAfterBOM - sourceStart) < ((uint32_t)~((uint32_t)0)))",
                                  "(sourceAfterBOM - sourceStart) < MAXUINT32");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    local_5c = (int)puStack_58 - (int)sourceEnd;
    sourceStart._4_4_ =
         LineOffsetCache::FindLineForCharacterOffset
                   (puStack_58,sourceAfterBOM,&local_38,&local_5c,outLineNumber_local._4_4_);
    *_lineCharOffset = local_5c;
  }
  else {
    this_00 = Memory::WriteBarrierPtr<Js::LineOffsetCache>::operator->(&this->m_lineOffsetCache);
    sourceStart._4_4_ =
         LineOffsetCache::GetLineForCharacterOffset
                   (this_00,outLineNumber_local._4_4_,&local_38,_lineCharOffset);
  }
  if (outLineNumber_local._4_4_ < local_38) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x13d,"(charPosition >= lineCharOffset)",
                                "charPosition >= lineCharOffset");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  *outColumn_local = sourceStart._4_4_;
  *outLineByteOffset_local = outLineNumber_local._4_4_ - local_38;
  return;
}

Assistant:

void Utf8SourceInfo::GetLineInfoForCharPosition(charcount_t charPosition, charcount_t *outLineNumber, charcount_t *outColumn, charcount_t *outLineByteOffset, bool allowSlowLookup)
    {
        AssertMsg(this->m_lineOffsetCache != nullptr || allowSlowLookup, "LineOffsetCache wasn't created, EnsureLineOffsetCache should have been called.");
        AssertMsg(outLineNumber != nullptr && outColumn != nullptr && outLineByteOffset != nullptr, "Expected out parameter's can't be a nullptr.");

        charcount_t lineCharOffset = 0;
        int line = 0;
        if (this->m_lineOffsetCache == nullptr)
        {
            LPCUTF8 sourceStart = this->GetSource(_u("Utf8SourceInfo::AllocateLineOffsetCache"));
            LPCUTF8 sourceEnd = sourceStart + this->GetCbLength(_u("Utf8SourceInfo::AllocateLineOffsetCache"));

            LPCUTF8 sourceAfterBOM = sourceStart;
            lineCharOffset = FunctionBody::SkipByteOrderMark(sourceAfterBOM /* byref */);
            Assert((sourceAfterBOM - sourceStart) < MAXUINT32);
            charcount_t byteStartOffset = (charcount_t)(sourceAfterBOM - sourceStart);

            line = LineOffsetCache::FindLineForCharacterOffset(sourceAfterBOM, sourceEnd, lineCharOffset, byteStartOffset, charPosition);

            *outLineByteOffset = byteStartOffset;
        }
        else
        {
            line = this->m_lineOffsetCache->GetLineForCharacterOffset(charPosition, &lineCharOffset, outLineByteOffset);
        }

        Assert(charPosition >= lineCharOffset);

        *outLineNumber = line;
        *outColumn = charPosition - lineCharOffset;
    }